

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O0

void update_view(chunk_conflict *c,player *p)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  _Bool _Var1;
  square_conflict *psVar2;
  loc lVar3;
  int local_20;
  int local_1c;
  wchar_t y;
  wchar_t x;
  player *p_local;
  chunk_conflict *c_local;
  
  mark_wasseen(c);
  calc_lighting(c,p);
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  psVar2 = square((chunk *)c,grid);
  flag_on_dbg(psVar2->info,3,6,"square(c, p->grid)->info","SQUARE_VIEW");
  if ((((L'\0' < (p->state).cur_light) ||
       (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y, _Var1 = square_islit((chunk *)c,grid_00),
       _Var1)) ||
      (_Var1 = flag_has_dbg((p->state).pflags,10,0x1f,"p->state.pflags","(PF_UNLIGHT)"), _Var1)) ||
     (_Var1 = player_of_has(p,L'+'), _Var1)) {
    grid_01.x = (p->grid).x;
    grid_01.y = (p->grid).y;
    psVar2 = square((chunk *)c,grid_01);
    flag_on_dbg(psVar2->info,3,5,"square(c, p->grid)->info","SQUARE_SEEN");
    grid_02.x = (p->grid).x;
    grid_02.y = (p->grid).y;
    psVar2 = square((chunk *)c,grid_02);
    flag_on_dbg(psVar2->info,3,0x15,"square(c, p->grid)->info","SQUARE_CLOSE_PLAYER");
  }
  if (((p->timed[2] != 0) &&
      (grid_03.x = (p->grid).x, grid_03.y = (p->grid).y, _Var1 = square_isknown((chunk *)c,grid_03),
      _Var1)) &&
     (grid_04.x = (p->grid).x, grid_04.y = (p->grid).y,
     _Var1 = square_ispassable((chunk *)p->cave,grid_04), !_Var1)) {
    grid_05.x = (p->grid).x;
    grid_05.y = (p->grid).y;
    square_forget((chunk *)c,grid_05);
  }
  for (local_20 = 0; local_20 < c->height; local_20 = local_20 + 1) {
    for (local_1c = 0; local_1c < c->width; local_1c = local_1c + 1) {
      lVar3 = loc(local_1c,local_20);
      update_view_one(c,lVar3,p);
    }
  }
  for (local_20 = 0; local_20 < c->height; local_20 = local_20 + 1) {
    for (local_1c = 0; local_1c < c->width; local_1c = local_1c + 1) {
      lVar3 = loc(local_1c,local_20);
      update_one(c,lVar3,p);
    }
  }
  return;
}

Assistant:

void update_view(struct chunk *c, struct player *p)
{
	int x, y;

	/* Record the current view */
	mark_wasseen(c);

	/* Calculate light levels */
	calc_lighting(c, p);

	/* Assume we can view the player grid */
	sqinfo_on(square(c, p->grid)->info, SQUARE_VIEW);
	if (p->state.cur_light > 0 || square_islit(c, p->grid) ||
		player_has(p, PF_UNLIGHT) || player_of_has(p, OF_DARKNESS)) {
		sqinfo_on(square(c, p->grid)->info, SQUARE_SEEN);
		sqinfo_on(square(c, p->grid)->info, SQUARE_CLOSE_PLAYER);
	}
	/*
	 * If the player is blind and in terrain that was remembered to be
	 * impassable, forget the remembered terrain.  This will have to be
	 * modified in variants that have timed effects which allow a player
	 * to move through impassable terrain.
	 */
	if (p->timed[TMD_BLIND] && square_isknown(c, p->grid)
			&& !square_ispassable(p->cave, p->grid)) {
		square_forget(c, p->grid);
	}

	/* Squares we have LOS to get marked as in the view, and perhaps seen */
	for (y = 0; y < c->height; y++)
		for (x = 0; x < c->width; x++)
			update_view_one(c, loc(x, y), p);

	/* Update each grid */
	for (y = 0; y < c->height; y++)
		for (x = 0; x < c->width; x++)
			update_one(c, loc(x, y), p);
}